

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

int __thiscall
lzham::lzcompressor::enumerate_lz_decisions
          (lzcompressor *this,uint ofs,state *cur_state,
          vector<lzham::lzcompressor::lzpriced_decision> *decisions,uint min_match_len,
          uint max_match_len)

{
  search_accelerator *dict;
  uint uVar1;
  lzpriced_decision *lzdec;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  dict_match *pdVar5;
  uint uVar6;
  long lVar7;
  uint lookahead_ofs;
  int iVar8;
  int local_84;
  uint local_80;
  uint local_78;
  bit_cost_t local_70;
  lzpriced_decision dec;
  
  dict = &this->m_accel;
  uVar6 = (this->m_accel).m_max_dict_size_mask;
  uVar1 = (this->m_accel).m_lookahead_pos;
  if (min_match_len < 2) {
    local_80 = 1;
    bVar3 = vector<lzham::lzcompressor::lzpriced_decision>::try_resize(decisions,1,false);
    if (!bVar3) {
      return -1;
    }
    lzdec = decisions->m_p;
    (lzdec->super_lzdecision).m_pos = ofs;
    (lzdec->super_lzdecision).m_len = 0;
    (lzdec->super_lzdecision).m_dist = 0;
    *(bit_cost_t *)(&lzdec->field_0xc + 4) = 0;
    local_70 = state::get_cost(cur_state,&this->super_CLZBase,dict,&lzdec->super_lzdecision);
    *(bit_cost_t *)(&lzdec->field_0xc + 4) = local_70;
  }
  else {
    local_80 = 0;
    bVar3 = vector<lzham::lzcompressor::lzpriced_decision>::try_resize(decisions,0,false);
    if (!bVar3) {
      return -1;
    }
    local_70 = 0xffffffffffffffff;
  }
  lookahead_ofs = ofs - (uVar6 & uVar1);
  local_84 = 0;
  iVar8 = -1;
  local_78 = 0;
  for (lVar7 = 2; lVar7 != 6; lVar7 = lVar7 + 1) {
    uVar4 = search_accelerator::get_match_len
                      (dict,lookahead_ofs,(cur_state->super_state_base).m_match_hist[lVar7 + -2],
                       max_match_len,0);
    if (min_match_len <= uVar4) {
      if ((1 < uVar4) || (lVar7 == 2 && uVar4 == 1)) {
        if (local_78 <= uVar4) {
          local_78 = uVar4;
        }
        dec.super_lzdecision.m_pos = ofs;
        dec.super_lzdecision.m_len = uVar4;
        dec.super_lzdecision.m_dist = iVar8;
        dec.m_cost = state::get_cost(cur_state,&this->super_CLZBase,dict,&dec.super_lzdecision);
        bVar3 = vector<lzham::lzcompressor::lzpriced_decision>::try_push_back(decisions,&dec);
        if (!bVar3) {
          return -1;
        }
        if ((local_80 < uVar4) || ((uVar4 == local_80 && (dec.m_cost < local_70)))) {
          local_84 = decisions->m_size - 1;
          local_70 = dec.m_cost;
          local_80 = uVar4;
        }
      }
    }
    iVar8 = iVar8 + -1;
  }
  if (max_match_len < 2) {
    return local_84;
  }
  if (local_78 < this->m_fast_bytes) {
    pdVar5 = search_accelerator::find_matches(dict,lookahead_ofs,true);
    if (pdVar5 == (dict_match *)0x0) {
      return local_84;
    }
    do {
      uVar6 = pdVar5->m_len + 2;
      if (max_match_len <= uVar6) {
        uVar6 = max_match_len;
      }
      if ((min_match_len <= uVar6) && (local_78 < uVar6)) {
        if ((0x101 < max_match_len) && (uVar6 == 0x101)) {
          uVar6 = search_accelerator::get_match_len
                            (dict,lookahead_ofs,pdVar5->m_dist & 0x7fffffff,max_match_len,0x101);
        }
        dec.super_lzdecision.m_dist = pdVar5->m_dist & 0x7fffffff;
        dec.super_lzdecision.m_pos = ofs;
        dec.super_lzdecision.m_len = uVar6;
        dec.m_cost = state::get_cost(cur_state,&this->super_CLZBase,dict,&dec.super_lzdecision);
        bVar3 = vector<lzham::lzcompressor::lzpriced_decision>::try_push_back(decisions,&dec);
        if (!bVar3) {
          return -1;
        }
        if ((local_80 < uVar6) || ((uVar6 == local_80 && (dec.m_cost < local_70)))) {
          local_84 = decisions->m_size - 1;
          local_70 = dec.m_cost;
          local_80 = uVar6;
        }
      }
      puVar2 = &pdVar5->m_dist;
      pdVar5 = pdVar5 + 1;
      if ((int)*puVar2 < 0) {
        return local_84;
      }
    } while( true );
  }
  return local_84;
}

Assistant:

int lzcompressor::enumerate_lz_decisions(uint ofs, const state& cur_state, lzham::vector<lzpriced_decision>& decisions, uint min_match_len, uint max_match_len)
   {
      LZHAM_ASSERT(min_match_len >= 1);

      uint start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();
      LZHAM_ASSERT(ofs >= start_ofs);
      const uint lookahead_ofs = ofs - start_ofs;

      uint largest_index = 0;
      uint largest_len;
      bit_cost_t largest_cost;

      if (min_match_len <= 1)
      {
         if (!decisions.try_resize(1))
         {
            LZHAM_LOG_ERROR(7038);
            return -1;
         }

         lzpriced_decision& lit_dec = decisions[0];
         lit_dec.init(ofs, 0, 0, 0);
         lit_dec.m_cost = cur_state.get_cost(*this, m_accel, lit_dec);
         largest_cost = lit_dec.m_cost;

         largest_len = 1;
      }
      else
      {
         if (!decisions.try_resize(0))
         {
            LZHAM_LOG_ERROR(7039);
            return -1;
         }

         largest_len = 0;
         largest_cost = cBitCostMax;
      }

      uint match_hist_max_len = 0;

      // Add rep matches.
      for (uint i = 0; i < cMatchHistSize; i++)
      {
         uint hist_match_len = m_accel.get_match_len(lookahead_ofs, cur_state.m_match_hist[i], max_match_len);
         if (hist_match_len < min_match_len)
            continue;

         if ( ((hist_match_len == 1) && (i == 0)) || (hist_match_len >= CLZBase::cMinMatchLen) )
         {
            match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

            lzpriced_decision dec(ofs, hist_match_len, -((int)i + 1));
            dec.m_cost = cur_state.get_cost(*this, m_accel, dec);

            if (!decisions.try_push_back(dec))
            {
               LZHAM_LOG_ERROR(7040);
               return -1;
            }

            if ( (hist_match_len > largest_len) || ((hist_match_len == largest_len) && (dec.m_cost < largest_cost)) )
            {
               largest_index = decisions.size() - 1;
               largest_len = hist_match_len;
               largest_cost = dec.m_cost;
            }
         }
      }

      // Now add full matches.
      if ((max_match_len >= CLZBase::cMinMatchLen) && (match_hist_max_len < m_fast_bytes))
      {
         const dict_match* pMatches = m_accel.find_matches(lookahead_ofs);

         if (pMatches)
         {
            for ( ; ; )
            {
               uint match_len = math::minimum(pMatches->get_len(), max_match_len);
               LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));

               // Full matches are very likely to be more expensive than rep matches of the same length, so don't bother evaluating them.
               if ((match_len >= min_match_len) && (match_len > match_hist_max_len))
               {
                  if ((max_match_len > CLZBase::cMaxMatchLen) && (match_len == CLZBase::cMaxMatchLen))
                  {
                     match_len = m_accel.get_match_len(lookahead_ofs, pMatches->get_dist(), max_match_len, CLZBase::cMaxMatchLen);
                  }

                  lzpriced_decision dec(ofs, match_len, pMatches->get_dist());
                  dec.m_cost = cur_state.get_cost(*this, m_accel, dec);

                  if (!decisions.try_push_back(dec))
                  {
                     LZHAM_LOG_ERROR(7041);
                     return -1;
                  }

                  if ( (match_len > largest_len) || ((match_len == largest_len) && (dec.get_cost() < largest_cost)) )
                  {
                     largest_index = decisions.size() - 1;
                     largest_len = match_len;
                     largest_cost = dec.get_cost();
                  }
               }
               if (pMatches->is_last())
                  break;
               pMatches++;
            }
         }
      }

      return largest_index;
   }